

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.hh
# Opt level: O0

void __thiscall avro::ResolvingDecoder::~ResolvingDecoder(ResolvingDecoder *this)

{
  code *pcVar1;
  ResolvingDecoder *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

class AVRO_DECL ResolvingDecoder : public Decoder {
public:
    /// Returns the order of fields for records.
    /// The order of fields could be different from the order of their
    /// order in the schema because the writer's field order could
    /// be different. In order to avoid buffering and later use,
    /// we return the values in the writer's field order.
    virtual const std::vector<size_t>& fieldOrder() = 0;
}